

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestGeodesicArcIntersect.cpp
# Opt level: O1

bool ParseTestGeodesicArcIntersect(string *sString)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  double dVar2;
  size_type sVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ostream *poVar9;
  long *plVar10;
  char *pcVar11;
  char *__n;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var12;
  ulong __n_00;
  char *unaff_R12;
  char *unaff_R13;
  pointer unaff_R14;
  char *unaff_R15;
  bool bVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  double dVar14;
  undefined1 auVar15 [12];
  LLPoint intPtC1;
  string soTestId;
  string soIntersection1Lat;
  string sIntPt2Lat;
  string soIntersection2Lon;
  string soIntersection2Lat;
  LLPoint intPtC2;
  LLPoint geodesicStart;
  string soIntersection1Lon;
  string soArcCenterLon;
  string soArcCenterLat;
  string soGeodesicStartLon;
  string soGeodesicStartLat;
  LLPoint arcCenter;
  string soArcRadius;
  string soGeodesicAzimuth;
  int sub_matches [13];
  sregex_token_iterator it;
  sregex_token_iterator s_end;
  LLPoint pt;
  LLPoint local_5f8;
  undefined1 local_5e8 [16];
  undefined1 local_5d8 [16];
  char *local_5c0;
  long local_5b8;
  char local_5b0 [16];
  char *local_5a0;
  char *local_598;
  char local_590 [16];
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_580;
  char *local_4f8;
  ulong local_4f0;
  char local_4e8 [16];
  char *local_4d8;
  char *local_4d0;
  char local_4c8 [16];
  LLPoint local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  char *local_488;
  char *local_480;
  char local_478 [16];
  undefined1 local_468 [16];
  undefined1 *local_458;
  long local_450;
  undefined1 local_448 [16];
  undefined1 *local_438;
  long local_430;
  undefined1 local_428 [16];
  undefined1 *local_418;
  long local_410;
  undefined1 local_408 [16];
  undefined1 *local_3f8;
  long local_3f0;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [32];
  char *local_3b8;
  undefined8 local_3b0;
  char local_3a8 [16];
  char *local_398;
  undefined8 local_390;
  char local_388 [16];
  string local_378;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined4 local_348;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_340;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  double local_f8;
  undefined8 uStack_f0;
  double local_e0;
  undefined1 local_d8 [32];
  pointer local_b8;
  pointer psStack_b0;
  pointer local_a8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_a0;
  pointer local_98;
  pointer piStack_90;
  pointer piStack_88;
  undefined1 uStack_80;
  undefined7 local_7f;
  undefined1 uStack_78;
  undefined8 uStack_77;
  size_t local_68;
  value_type *pvStack_60;
  bool local_58;
  
  lVar7 = std::__cxx11::string::find_last_not_of((char *)sString,0x15c234,0xffffffffffffffff);
  uVar8 = lVar7 + 1;
  if (sString->_M_string_length < uVar8) {
    auVar15 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase",uVar8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_580);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)local_d8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_340);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_3d8);
    if (local_4a8._M_dataplus._M_p != unaff_R14) {
      operator_delete(local_4a8._M_dataplus._M_p);
    }
    if (auVar15._8_4_ != 1) {
      if (local_4f8 != unaff_R13) {
        operator_delete(local_4f8);
      }
      if (local_4d8 != unaff_R12) {
        operator_delete(local_4d8);
      }
      if (local_488 != unaff_R15) {
        operator_delete(local_488);
      }
      if (local_5a0 != local_590) {
        operator_delete(local_5a0);
      }
      if (local_3b8 != local_3a8) {
        operator_delete(local_3b8);
      }
      if (local_458 != local_448) {
        operator_delete(local_458);
      }
      if (local_438 != local_428) {
        operator_delete(local_438);
      }
      if (local_398 != local_388) {
        operator_delete(local_398);
      }
      if (local_418 != local_408) {
        operator_delete(local_418);
      }
      if (local_3f8 != local_3e8) {
        operator_delete(local_3f8);
      }
      if (local_5c0 != local_5b0) {
        operator_delete(local_5c0);
      }
      _Unwind_Resume(auVar15._0_8_);
    }
    plVar10 = (long *)__cxa_begin_catch(auVar15._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    pcVar11 = (char *)(**(code **)(*plVar10 + 0x10))(plVar10);
    std::operator<<((ostream *)&std::cout,pcVar11);
    __cxa_end_catch();
    bVar5 = false;
  }
  else {
    sString->_M_string_length = uVar8;
    (sString->_M_dataplus)._M_p[uVar8] = '\0';
    std::__cxx11::string::find_first_not_of((char *)sString,0x15c234,0);
    std::__cxx11::string::erase((ulong)sString,0);
    local_5c0 = local_5b0;
    local_5b8 = 0;
    local_5b0[0] = '\0';
    local_3f8 = local_3e8;
    local_3f0 = 0;
    local_3e8[0] = 0;
    local_418 = local_408;
    local_410 = 0;
    local_408[0] = 0;
    local_398 = local_388;
    local_390 = 0;
    local_388[0] = '\0';
    local_438 = local_428;
    local_430 = 0;
    local_428[0] = 0;
    local_458 = local_448;
    local_450 = 0;
    local_448[0] = 0;
    local_3b8 = local_3a8;
    local_3b0 = 0;
    local_3a8[0] = '\0';
    local_5a0 = local_590;
    local_598 = (char *)0x0;
    local_590[0] = '\0';
    unaff_R15 = local_478;
    local_480 = (char *)0x0;
    local_478[0] = '\0';
    unaff_R12 = local_4c8;
    local_4d0 = (char *)0x0;
    local_4c8[0] = '\0';
    unaff_R13 = local_4e8;
    local_4f0 = 0;
    local_4e8[0] = '\0';
    local_4f8 = unaff_R13;
    local_4d8 = unaff_R12;
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    local_488 = unaff_R15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4a8,"([a-z]*|[A-Z]*\\d*)[,]","");
    std::__cxx11::string::append((char *)&local_4a8);
    std::__cxx11::string::append((char *)&local_4a8);
    std::__cxx11::string::append((char *)&local_4a8);
    std::__cxx11::string::append((char *)&local_4a8);
    std::__cxx11::string::append((char *)&local_4a8);
    std::__cxx11::string::append((char *)&local_4a8);
    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_3d8,&local_4a8,0x11);
    local_358 = 0xa00000009;
    uStack_350 = 0xc0000000b;
    local_378.field_2._M_allocated_capacity = 0x600000005;
    local_378.field_2._8_8_ = 0x800000007;
    local_378._M_dataplus._M_p = (char *)0x200000001;
    local_378._M_string_length = 0x400000003;
    local_348 = 0xd;
    _Var1._M_current = (sString->_M_dataplus)._M_p;
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
    ::regex_token_iterator<13ul>
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
                *)&local_340,_Var1,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(_Var1._M_current + sString->_M_string_length),(regex_type *)local_3d8,
               (int (*) [13])&local_378,0);
    uStack_78 = 0;
    uStack_77 = 0;
    piStack_88 = (pointer)0x0;
    uStack_80 = 0;
    local_7f = 0;
    local_98 = (pointer)0x0;
    piStack_90 = (pointer)0x0;
    local_a8 = (pointer)0x0;
    _Stack_a0._M_current = (char *)0x0;
    local_b8 = (pointer)0x0;
    psStack_b0 = (pointer)0x0;
    local_d8._16_8_ = (regex_type *)0x0;
    local_d8._24_8_ = 0;
    local_d8._0_8_ = (char *)0x0;
    local_d8._8_8_ = (char *)0x0;
    local_68 = 0;
    pvStack_60 = (value_type *)0x0;
    local_58 = false;
    bVar5 = std::__cxx11::
            regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
            ::operator==(&local_340,
                         (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                          *)local_d8);
    if (!bVar5) {
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_580,&local_340,0);
      local_5f8.latitude = (double)local_5e8;
      if ((local_580._M_result)->matched == true) {
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_5f8,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_5f8.longitude = 0.0;
        local_5e8[0] = 0;
      }
      std::__cxx11::string::operator=((string *)&local_5c0,(string *)&local_5f8);
      if ((undefined1 *)local_5f8.latitude != local_5e8) {
        operator_delete((void *)local_5f8.latitude);
      }
      if (local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_580._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_580,&local_340,0);
      if ((local_580._M_result)->matched == true) {
        local_5f8.latitude = (double)local_5e8;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_5f8,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_5f8.longitude = 0.0;
        local_5e8[0] = 0;
        local_5f8.latitude = (double)local_5e8;
      }
      std::__cxx11::string::operator=((string *)&local_3f8,(string *)&local_5f8);
      if ((undefined1 *)local_5f8.latitude != local_5e8) {
        operator_delete((void *)local_5f8.latitude);
      }
      if (local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_580._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_580,&local_340,0);
      if ((local_580._M_result)->matched == true) {
        local_5f8.latitude = (double)local_5e8;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_5f8,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_5f8.longitude = 0.0;
        local_5e8[0] = 0;
        local_5f8.latitude = (double)local_5e8;
      }
      std::__cxx11::string::operator=((string *)&local_418,(string *)&local_5f8);
      if ((undefined1 *)local_5f8.latitude != local_5e8) {
        operator_delete((void *)local_5f8.latitude);
      }
      if (local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_580._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_580,&local_340,0);
      if ((local_580._M_result)->matched == true) {
        local_5f8.latitude = (double)local_5e8;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_5f8,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_5f8.longitude = 0.0;
        local_5e8[0] = 0;
        local_5f8.latitude = (double)local_5e8;
      }
      std::__cxx11::string::operator=((string *)&local_398,(string *)&local_5f8);
      if ((undefined1 *)local_5f8.latitude != local_5e8) {
        operator_delete((void *)local_5f8.latitude);
      }
      if (local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_580._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_580,&local_340,0);
      if ((local_580._M_result)->matched == true) {
        local_5f8.latitude = (double)local_5e8;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_5f8,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_5f8.longitude = 0.0;
        local_5e8[0] = 0;
        local_5f8.latitude = (double)local_5e8;
      }
      std::__cxx11::string::operator=((string *)&local_438,(string *)&local_5f8);
      if ((undefined1 *)local_5f8.latitude != local_5e8) {
        operator_delete((void *)local_5f8.latitude);
      }
      if (local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_580._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_580,&local_340,0);
      if ((local_580._M_result)->matched == true) {
        local_5f8.latitude = (double)local_5e8;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_5f8,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_5f8.longitude = 0.0;
        local_5e8[0] = 0;
        local_5f8.latitude = (double)local_5e8;
      }
      std::__cxx11::string::operator=((string *)&local_458,(string *)&local_5f8);
      if ((undefined1 *)local_5f8.latitude != local_5e8) {
        operator_delete((void *)local_5f8.latitude);
      }
      if (local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_580._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_580,&local_340,0);
      if ((local_580._M_result)->matched == true) {
        local_5f8.latitude = (double)local_5e8;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_5f8,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_5f8.longitude = 0.0;
        local_5e8[0] = 0;
        local_5f8.latitude = (double)local_5e8;
      }
      std::__cxx11::string::operator=((string *)&local_3b8,(string *)&local_5f8);
      if ((undefined1 *)local_5f8.latitude != local_5e8) {
        operator_delete((void *)local_5f8.latitude);
      }
      if (local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_580._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_580,&local_340,0);
      if ((local_580._M_result)->matched == true) {
        local_5f8.latitude = (double)local_5e8;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_5f8,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_5f8.longitude = 0.0;
        local_5e8[0] = 0;
        local_5f8.latitude = (double)local_5e8;
      }
      std::__cxx11::string::operator=((string *)&local_5a0,(string *)&local_5f8);
      if ((undefined1 *)local_5f8.latitude != local_5e8) {
        operator_delete((void *)local_5f8.latitude);
      }
      if (local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_580._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_580,&local_340,0);
      if ((local_580._M_result)->matched == true) {
        local_5f8.latitude = (double)local_5e8;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_5f8,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_5f8.longitude = 0.0;
        local_5e8[0] = 0;
        local_5f8.latitude = (double)local_5e8;
      }
      std::__cxx11::string::operator=((string *)&local_488,(string *)&local_5f8);
      if ((undefined1 *)local_5f8.latitude != local_5e8) {
        operator_delete((void *)local_5f8.latitude);
      }
      if (local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_580._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_580,&local_340,0);
      if ((local_580._M_result)->matched == true) {
        local_5f8.latitude = (double)local_5e8;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_5f8,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_5f8.longitude = 0.0;
        local_5e8[0] = 0;
        local_5f8.latitude = (double)local_5e8;
      }
      std::__cxx11::string::operator=((string *)&local_4d8,(string *)&local_5f8);
      if ((undefined1 *)local_5f8.latitude != local_5e8) {
        operator_delete((void *)local_5f8.latitude);
      }
      if (local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_580._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_580,&local_340,0);
      if ((local_580._M_result)->matched == true) {
        local_5f8.latitude = (double)local_5e8;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_5f8,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_580._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_5f8.longitude = 0.0;
        local_5e8[0] = 0;
        local_5f8.latitude = (double)local_5e8;
      }
      std::__cxx11::string::operator=((string *)&local_4f8,(string *)&local_5f8);
      if ((undefined1 *)local_5f8.latitude != local_5e8) {
        operator_delete((void *)local_5f8.latitude);
      }
      if (local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_580._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (local_98 != (pointer)0x0) {
      operator_delete(local_98);
    }
    if (local_b8 != (pointer)0x0) {
      operator_delete(local_b8);
    }
    if (local_340._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_340._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_340._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_340._M_position._M_match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p);
    }
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_118,local_3f8,local_3f8 + local_3f0);
    local_5d8._0_8_ = ParseLatitude(&local_118);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_138,local_418,local_418 + local_410);
    local_4a8._M_string_length = (size_type)ParseLongitude(&local_138);
    local_4a8._M_dataplus._M_p = (pointer)((double)local_5d8._0_8_ * 0.017453292519943295);
    local_4a8._M_string_length =
         (size_type)((double)local_4a8._M_string_length * 0.017453292519943295);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_158,local_438,local_438 + local_430);
    dVar14 = ParseLatitude(&local_158);
    local_5d8._0_8_ = dVar14;
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_178,local_458,local_458 + local_450);
    local_3d8._8_8_ = ParseLongitude(&local_178);
    local_3d8._0_8_ = (double)local_5d8._0_8_ * 0.017453292519943295;
    local_3d8._8_8_ = (double)local_3d8._8_8_ * 0.017453292519943295;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    dVar14 = atof(local_398);
    local_5d8._0_8_ = dVar14;
    local_468._0_8_ = atof(local_3b8);
    iVar6 = std::__cxx11::string::compare((char *)&local_5a0);
    if (iVar6 != 0) {
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_198,local_5a0,local_598 + (long)local_5a0);
      dVar14 = ParseLatitude(&local_198);
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                (SUB84(dVar14,0),&local_1b8,local_488,local_480 + (long)local_488);
      ParseLongitude(&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,local_4d8,local_4d0 + (long)local_4d8);
      dVar14 = ParseLatitude(&local_1d8);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                (SUB84(dVar14,0),&local_1f8,local_4f8,local_4f8 + local_4f0);
      ParseLongitude(&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
    }
    local_5f8.latitude = 0.0;
    local_5f8.longitude = 0.0;
    local_4b8.latitude = 0.0;
    local_4b8.longitude = 0.0;
    iVar6 = GeoCalcs::GeodesicArcIntercept
                      ((LLPoint *)&local_4a8,(double)local_5d8._0_8_ * 0.017453292519943295,
                       (LLPoint *)local_3d8,(double)local_468._0_8_ * 1852.0,&local_5f8,&local_4b8,
                       1e-09);
    if (iVar6 < 1) {
      iVar6 = std::__cxx11::string::compare((char *)&local_5a0);
      bVar5 = iVar6 == 0;
    }
    else {
      local_5d8._8_8_ = 0;
      local_5d8._0_8_ = local_5f8.latitude;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,local_4d8,local_4d0 + (long)local_4d8);
      dVar14 = ParseLatitude(&local_218);
      dVar2 = ABS((double)local_5d8._0_8_ - dVar14 * 0.017453292519943295);
      uVar8 = local_5d8._8_8_ & 0x7fffffffffffffff;
      dVar14 = ABS(dVar14 * 0.017453292519943295);
      if (ABS((double)local_5d8._0_8_) <= dVar14) {
        dVar14 = ABS((double)local_5d8._0_8_);
      }
      local_5d8._8_8_ = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) & 0x7fffffffffffffff;
      local_5d8._0_8_ = dVar14 * 0.0017453292519943296;
      if (dVar14 * 0.0017453292519943296 < dVar2) {
        bVar5 = false;
      }
      else {
        local_468._8_4_ = (int)uVar8;
        local_468._0_8_ = dVar2;
        local_468._12_4_ = (int)(uVar8 >> 0x20);
        local_f8 = local_5f8.longitude;
        uStack_f0 = 0;
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,local_4f8,local_4f8 + local_4f0);
        dVar14 = ParseLongitude(&local_238);
        dVar2 = ABS(dVar14 * 0.017453292519943295);
        if (ABS(local_f8) <= dVar2) {
          dVar2 = ABS(local_f8);
        }
        bVar5 = ABS(local_f8 - dVar14 * 0.017453292519943295) <= dVar2 * 0.0017453292519943296;
        dVar2 = local_468._0_8_;
      }
      if ((dVar2 <= (double)local_5d8._0_8_) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2)) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
      dVar2 = local_5f8.longitude;
      dVar14 = local_5f8.latitude;
      if (bVar5) {
        local_5f8.latitude = local_4b8.latitude;
        local_5f8.longitude = local_4b8.longitude;
        local_4b8.latitude = dVar14;
        local_4b8.longitude = dVar2;
      }
      local_d8._0_8_ = local_5f8.latitude * 57.29577951308232;
      ConvertLatitudeDdToDms_abi_cxx11_((string *)&local_340,(double *)local_d8);
      local_580._M_position._M_begin._M_current = (char *)(local_5f8.longitude * 57.29577951308232);
      ConvertLongitudeDdToDms_abi_cxx11_((string *)local_d8,(double *)&local_580);
      local_378._M_dataplus._M_p = (pointer)(local_4b8.latitude * 57.29577951308232);
      ConvertLatitudeDdToDms_abi_cxx11_((string *)&local_580,(double *)&local_378);
      local_e0 = local_4b8.longitude * 57.29577951308232;
      ConvertLongitudeDdToDms_abi_cxx11_(&local_378,&local_e0);
      _Var1._M_current = local_340._M_position._M_end._M_current;
      pcVar11 = local_598;
      _Var12._M_current = local_340._M_position._M_end._M_current;
      if (local_598 < local_340._M_position._M_end._M_current) {
        _Var12._M_current = local_598;
      }
      bVar5 = true;
      bVar13 = true;
      if (_Var12._M_current != (char *)0x0) {
        iVar6 = bcmp(local_340._M_position._M_begin._M_current,local_5a0,(size_t)_Var12._M_current);
        bVar13 = iVar6 == 0;
      }
      if (!(bool)(bVar13 & _Var1._M_current == pcVar11)) {
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,local_5a0,pcVar11 + (long)local_5a0);
        dVar14 = ParseLatitude(&local_258);
        dVar2 = dVar14 * 0.017453292519943295;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          local_5d8._8_4_ = extraout_XMM0_Dc_00;
          local_5d8._0_8_ = dVar14 * 0.017453292519943295;
          local_5d8._12_4_ = extraout_XMM0_Dd_00;
          operator_delete(local_258._M_dataplus._M_p);
          dVar2 = (double)local_5d8._0_8_;
        }
        dVar14 = ABS(local_5f8.latitude);
        if (ABS(dVar2) <= ABS(local_5f8.latitude)) {
          dVar14 = ABS(dVar2);
        }
        if (ABS(dVar2 - local_5f8.latitude) <= dVar14 * 1e-10) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_5c0,local_5b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," within rounding tolerance of 1e-10: Input Intersection 1 latitude: ",
                     0x44);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_5a0,(long)local_598);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  calced: ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,local_340._M_position._M_begin._M_current,
                     (long)local_340._M_position._M_end._M_current);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_5c0,local_5b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," failed: Expected Intersection 1 latitude: ",0x2b);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_5a0,(long)local_598);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  calced: ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,local_340._M_position._M_begin._M_current,
                     (long)local_340._M_position._M_end._M_current);
          bVar5 = false;
        }
      }
      uVar4 = local_d8._8_8_;
      pcVar11 = local_480;
      __n = (char *)local_d8._8_8_;
      if (local_480 < (ulong)local_d8._8_8_) {
        __n = local_480;
      }
      if (__n == (char *)0x0) {
        bVar13 = true;
      }
      else {
        iVar6 = bcmp((void *)local_d8._0_8_,local_488,(size_t)__n);
        bVar13 = iVar6 == 0;
      }
      if (!(bool)(bVar13 & (char *)uVar4 == pcVar11)) {
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,local_488,pcVar11 + (long)local_488);
        dVar14 = ParseLatitude(&local_278);
        dVar2 = dVar14 * 0.017453292519943295;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          local_5d8._8_4_ = extraout_XMM0_Dc_01;
          local_5d8._0_8_ = dVar14 * 0.017453292519943295;
          local_5d8._12_4_ = extraout_XMM0_Dd_01;
          operator_delete(local_278._M_dataplus._M_p);
          dVar2 = (double)local_5d8._0_8_;
        }
        dVar14 = ABS(local_5f8.longitude);
        if (ABS(dVar2) <= ABS(local_5f8.longitude)) {
          dVar14 = ABS(dVar2);
        }
        if (ABS(dVar2 - local_5f8.longitude) <= dVar14 * 1e-10) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_5c0,local_5b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," within rounding tolerance of 1e-10: Input Intersection 1 longitude: ",
                     0x45);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_488,(long)local_480);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  calced: ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,(char *)local_d8._0_8_,local_d8._8_8_);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_5c0,local_5b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," failed: Expected Intersection 1 longitude: ",0x2c);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_488,(long)local_480);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  calced: ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,(char *)local_d8._0_8_,local_d8._8_8_);
          bVar5 = false;
        }
      }
      pcVar11 = local_4d0;
      _Var1._M_current = local_580._M_position._M_end._M_current;
      _Var12._M_current = local_580._M_position._M_end._M_current;
      if (local_4d0 < local_580._M_position._M_end._M_current) {
        _Var12._M_current = local_4d0;
      }
      if (_Var12._M_current == (char *)0x0) {
        bVar13 = true;
      }
      else {
        iVar6 = bcmp(local_580._M_position._M_begin._M_current,local_4d8,(size_t)_Var12._M_current);
        bVar13 = iVar6 == 0;
      }
      if (!(bool)(bVar13 & _Var1._M_current == pcVar11)) {
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_4d8,pcVar11 + (long)local_4d8);
        dVar14 = ParseLatitude(&local_298);
        dVar2 = dVar14 * 0.017453292519943295;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          local_5d8._8_4_ = extraout_XMM0_Dc_02;
          local_5d8._0_8_ = dVar14 * 0.017453292519943295;
          local_5d8._12_4_ = extraout_XMM0_Dd_02;
          operator_delete(local_298._M_dataplus._M_p);
          dVar2 = (double)local_5d8._0_8_;
        }
        dVar14 = ABS(local_4b8.latitude);
        if (ABS(dVar2) <= ABS(local_4b8.latitude)) {
          dVar14 = ABS(dVar2);
        }
        if (ABS(dVar2 - local_4b8.latitude) <= dVar14 * 1e-10) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_5c0,local_5b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," within rounding tolerance of 1e-10: Input Intersection 2 latitude: ",
                     0x44);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_4d8,(long)local_4d0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  calced: ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,local_580._M_position._M_begin._M_current,
                     (long)local_580._M_position._M_end._M_current);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_5c0,local_5b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," failed: Expected Intersection 2 latitude: ",0x2b);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_4d8,(long)local_4d0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  calced: ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,local_580._M_position._M_begin._M_current,
                     (long)local_580._M_position._M_end._M_current);
          bVar5 = false;
        }
      }
      sVar3 = local_378._M_string_length;
      uVar8 = local_4f0;
      __n_00 = local_378._M_string_length;
      if (local_4f0 < local_378._M_string_length) {
        __n_00 = local_4f0;
      }
      if (__n_00 == 0) {
        bVar13 = true;
      }
      else {
        iVar6 = bcmp(local_378._M_dataplus._M_p,local_4f8,__n_00);
        bVar13 = iVar6 == 0;
      }
      if (!(bool)(bVar13 & sVar3 == uVar8)) {
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_2b8,local_4f8,local_4f8 + uVar8);
        dVar14 = ParseLatitude(&local_2b8);
        dVar2 = dVar14 * 0.017453292519943295;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          local_5d8._8_4_ = extraout_XMM0_Dc_03;
          local_5d8._0_8_ = dVar14 * 0.017453292519943295;
          local_5d8._12_4_ = extraout_XMM0_Dd_03;
          operator_delete(local_2b8._M_dataplus._M_p);
          dVar2 = (double)local_5d8._0_8_;
        }
        dVar14 = ABS(local_4b8.longitude);
        if (ABS(dVar2) <= ABS(local_4b8.longitude)) {
          dVar14 = ABS(dVar2);
        }
        if (ABS(dVar2 - local_4b8.longitude) <= dVar14 * 1e-10) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_5c0,local_5b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," within rounding tolerance of 1e-10: Input Intersection 2 longitude: ",
                     0x45);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_4f8,local_4f0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  calced: ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,local_378._M_dataplus._M_p,local_378._M_string_length);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_5c0,local_5b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," failed: Expected Intersection 2 longitude: ",0x2c);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_4f8,local_4f0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  calced: ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,local_378._M_dataplus._M_p,local_378._M_string_length);
          bVar5 = false;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p);
      }
      if ((regex_type **)local_580._M_position._M_begin._M_current !=
          &local_580._M_position._M_pregex) {
        operator_delete(local_580._M_position._M_begin._M_current);
      }
      if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
        operator_delete((void *)local_d8._0_8_);
      }
      if ((regex_type **)local_340._M_position._M_begin._M_current !=
          &local_340._M_position._M_pregex) {
        operator_delete(local_340._M_position._M_begin._M_current);
      }
    }
  }
  if (local_4f8 != unaff_R13) {
    operator_delete(local_4f8);
  }
  if (local_4d8 != unaff_R12) {
    operator_delete(local_4d8);
  }
  if (local_488 != unaff_R15) {
    operator_delete(local_488);
  }
  if (local_5a0 != local_590) {
    operator_delete(local_5a0);
  }
  if (local_3b8 != local_3a8) {
    operator_delete(local_3b8);
  }
  if (local_458 != local_448) {
    operator_delete(local_458);
  }
  if (local_438 != local_428) {
    operator_delete(local_438);
  }
  if (local_398 != local_388) {
    operator_delete(local_398);
  }
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  if (local_3f8 != local_3e8) {
    operator_delete(local_3f8);
  }
  if (local_5c0 != local_5b0) {
    operator_delete(local_5c0);
  }
  return bVar5;
}

Assistant:

bool ParseTestGeodesicArcIntersect(string sString)
{
    bool bPassed = true;
    trim(sString);
    string soTestId, soGeodesicStartLat, soGeodesicStartLon;
    string soGeodesicAzimuth, soArcCenterLat, soArcCenterLon;
    string soArcRadius, soIntersection1Lat, soIntersection1Lon;
    string soIntersection2Lat, soIntersection2Lon;

    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "([a-z]*|[A-Z]*\\d*)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])";

        regex pat(sRxPat, flags);

        int const sub_matches[] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13,};
        sregex_token_iterator it(sString.begin(), sString.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            soTestId = *it++;
            soGeodesicStartLat = *it++;
            soGeodesicStartLon = *it++;
            soGeodesicAzimuth = *it++;
            soArcCenterLat = *it++;
            soArcCenterLon = *it++;
            soArcRadius = *it++;
            soIntersection1Lat = *it++;
            soIntersection1Lon = *it++;
            soIntersection2Lat = *it++;
            soIntersection2Lon = *it++;

        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }

    LLPoint geodesicStart(Deg2Rad(ParseLatitude(soGeodesicStartLat)), Deg2Rad(ParseLongitude(soGeodesicStartLon)));
    LLPoint arcCenter(Deg2Rad(ParseLatitude(soArcCenterLat)), Deg2Rad(ParseLongitude(soArcCenterLon)));
    double geodesicAzimuth = Deg2Rad(atof(soGeodesicAzimuth.c_str()));
    double arcRadius = NmToMeters(atof(soArcRadius.c_str()));
    LLPoint intersection1;
    LLPoint intersection2;
    if (soIntersection1Lat != "N/A")
    {
        intersection1.Set(Deg2Rad(ParseLatitude(soIntersection1Lat)), Deg2Rad(ParseLongitude(soIntersection1Lon)));
        intersection2.Set(Deg2Rad(ParseLatitude(soIntersection2Lat)), Deg2Rad(ParseLongitude(soIntersection2Lon)));
    }

    LLPoint intPtC1, intPtC2;
    int nIndex = GeodesicArcIntercept(geodesicStart, geodesicAzimuth, arcCenter, arcRadius, intPtC1, intPtC2, kTol);
    if (nIndex < 1)
    {
        if (soIntersection1Lat != "N/A")
            bPassed = false;

    }
    else
    {
        if (IsApprox(intPtC1.latitude, Deg2Rad(ParseLatitude(soIntersection2Lat)), Deg2Rad(0.1)) &&
            IsApprox(intPtC1.longitude, Deg2Rad(ParseLongitude(soIntersection2Lon)), Deg2Rad(0.1)))
        {
            LLPoint pt = intPtC1;
            intPtC1 = intPtC2;
            intPtC2 = pt;
        }

        string sIntPt1Lat = ConvertLatitudeDdToDms(Rad2Deg(intPtC1.latitude));
        string sIntPt1Lon = ConvertLongitudeDdToDms(Rad2Deg(intPtC1.longitude));
        string sIntPt2Lat = ConvertLatitudeDdToDms(Rad2Deg(intPtC2.latitude));
        string sIntPt2Lon = ConvertLongitudeDdToDms(Rad2Deg(intPtC2.longitude));

        if (sIntPt1Lat.compare(soIntersection1Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(soIntersection1Lat));
            if (IsApprox(dLat, intPtC1.latitude, 1e-10))
            {
                cout << "\n" << soTestId << " within rounding tolerance of 1e-10: Input Intersection 1 latitude: " <<
                soIntersection1Lat << "  calced: " << sIntPt1Lat;
            }
            else
            {
                cout << "\n" << soTestId << " failed: Expected Intersection 1 latitude: " << soIntersection1Lat <<
                "  calced: " << sIntPt1Lat;
                bPassed = false;
            }
        }

        if (sIntPt1Lon.compare(soIntersection1Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLatitude(soIntersection1Lon));
            if (IsApprox(dLon, intPtC1.longitude, 1e-10))
            {
                cout << "\n" << soTestId << " within rounding tolerance of 1e-10: Input Intersection 1 longitude: " <<
                soIntersection1Lon << "  calced: " << sIntPt1Lon;
            }
            else
            {
                cout << "\n" << soTestId << " failed: Expected Intersection 1 longitude: " << soIntersection1Lon <<
                "  calced: " << sIntPt1Lon;
                bPassed = false;
            }
        }

        if (sIntPt2Lat.compare(soIntersection2Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(soIntersection2Lat));
            if (IsApprox(dLat, intPtC2.latitude, 1e-10))
            {
                cout << "\n" << soTestId << " within rounding tolerance of 1e-10: Input Intersection 2 latitude: " <<
                soIntersection2Lat << "  calced: " << sIntPt2Lat;
            }
            else
            {
                cout << "\n" << soTestId << " failed: Expected Intersection 2 latitude: " << soIntersection2Lat <<
                "  calced: " << sIntPt2Lat;
                bPassed = false;
            }
        }

        if (sIntPt2Lon.compare(soIntersection2Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLatitude(soIntersection2Lon));
            if (IsApprox(dLon, intPtC2.longitude, 1e-10))
            {
                cout << "\n" << soTestId << " within rounding tolerance of 1e-10: Input Intersection 2 longitude: " <<
                soIntersection2Lon << "  calced: " << sIntPt2Lon;
            }
            else
            {
                cout << "\n" << soTestId << " failed: Expected Intersection 2 longitude: " << soIntersection2Lon <<
                "  calced: " << sIntPt2Lon;
                bPassed = false;
            }
        }

    }


    return bPassed;
}